

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O3

void vocini(voccxdef *vocctx,errcxdef *errctx,mcmcxdef *memctx,runcxdef *runctx,objucxdef *undoctx,
           int fuses,int daemons,int notifiers)

{
  memset(&vocctx->voccxtio,0,0x11a0);
  vocctx->voccxerr = errctx;
  vocctx->voccxiplst = 0xffffffff;
  vocctx->voccxilst = 0x2000;
  vocctx->voccxmem = memctx;
  vocctx->voccxrun = runctx;
  vocctx->voccxundo = undoctx;
  vocctx->voccxendcmd = 0xffff;
  vocctx->voccxpreinit = 0xffff;
  vocctx->voccxlsv = 0xffff;
  vocctx->voccxvtk = 0xffff;
  vocctx->voccxme = 0xffff;
  vocctx->voccxme_init = 0xffff;
  vocctx->voccxstr = 0xffff;
  vocctx->voccxnum = 0xffff;
  vocctx->voccxit = 0xffff;
  vocctx->voccxhim = 0xffff;
  vocctx->voccxher = 0xffff;
  vocctx->voccxprd = 0xffff;
  vocctx->voccxpre = 0xffff;
  vocctx->voccxppc = 0xffff;
  vocctx->voccxpre2 = 0xffff;
  vocctx->voccxper = 0xffff;
  vocctx->voccxprom = 0xffff;
  vocctx->voccxpostprom = 0xffff;
  vocctx->voccxpdis = 0xffff;
  vocctx->voccxper2 = 0xffff;
  vocctx->voccxperp = 0xffff;
  vocctx->voccxpdef = 0xffff;
  vocctx->voccxpdef2 = 0xffff;
  vocctx->voccxpdef2 = 0xffff;
  vocctx->voccxpask = 0xffff;
  vocctx->voccxpask2 = 0xffff;
  vocctx->voccxpask3 = 0xffff;
  vocctx->voccxinitrestore = 0xffff;
  vocctx->voccxpuv = 0xffff;
  vocctx->voccxpnp = 0xffff;
  vocctx->voccxpostact = 0xffff;
  vocctx->voccxactor = 0xffff;
  vocctx->voccxverb = 0xffff;
  vocctx->voccxprep = 0xffff;
  vocctx->voccxlastunk = 0;
  vocctx->voccxdobj = (vocoldef *)0x0;
  vocctx->voccxiobj = (vocoldef *)0x0;
  vocctx->voc_stk_ptr = (uchar *)0x0;
  vocctx->voc_stk_cur = (uchar *)0x0;
  vocctx->voc_stk_end = (uchar *)0x0;
  vocctx->voccxfuc = fuses;
  vocinialo(vocctx,&vocctx->voccxfus,fuses);
  vocctx->voccxdmc = daemons;
  vocinialo(vocctx,&vocctx->voccxdmn,daemons);
  vocctx->voccxalc = notifiers;
  vocinialo(vocctx,&vocctx->voccxalm,notifiers);
  vocctx->voccxwfre = 0xffffffff;
  return;
}

Assistant:

void vocini(voccxdef *vocctx, errcxdef *errctx, mcmcxdef *memctx,
            runcxdef *runctx, objucxdef *undoctx,
            int fuses, int daemons, int notifiers)
{
    CLRSTRUCT(*vocctx);
    vocctx->voccxerr = errctx;
    vocctx->voccxiplst = (uint)-1;
    vocctx->voccxilst = VOCISIZ;
    vocctx->voccxmem = memctx;
    vocctx->voccxrun = runctx;
    vocctx->voccxundo = undoctx;

    vocctx->voccxme  =
    vocctx->voccxme_init = 
    vocctx->voccxvtk =
    vocctx->voccxstr =
    vocctx->voccxnum =
    vocctx->voccxit  =
    vocctx->voccxhim =
    vocctx->voccxprd =
    vocctx->voccxpre =
    vocctx->voccxpre2 =
    vocctx->voccxppc =
    vocctx->voccxlsv =
    vocctx->voccxpreinit =
    vocctx->voccxper =
    vocctx->voccxprom =
    vocctx->voccxpostprom =
    vocctx->voccxpdis =
    vocctx->voccxper2 =
    vocctx->voccxperp =
    vocctx->voccxpdef =
    vocctx->voccxpdef2 =
    vocctx->voccxpask =
    vocctx->voccxpask2 =
    vocctx->voccxpask3 =
    vocctx->voccxinitrestore =
    vocctx->voccxpuv =
    vocctx->voccxpnp =
    vocctx->voccxpostact =
    vocctx->voccxendcmd =
    vocctx->voccxher = MCMONINV;
    vocctx->voccxthc = 0;
#ifdef VOCW_IN_CACHE
    vocctx->voccxwplck = MCMONINV;
#endif

    vocctx->voccxactor = MCMONINV;
    vocctx->voccxverb = MCMONINV;
    vocctx->voccxprep = MCMONINV;
    vocctx->voccxdobj = 0;
    vocctx->voccxiobj = 0;

    vocctx->voccxunknown = 0;
    vocctx->voccxlastunk = 0;

    vocctx->voc_stk_ptr = 0;
    vocctx->voc_stk_cur = 0;
    vocctx->voc_stk_end = 0;

    /* allocate fuses, daemons, notifiers */
    vocinialo(vocctx, &vocctx->voccxfus, (vocctx->voccxfuc = fuses));
    vocinialo(vocctx, &vocctx->voccxdmn, (vocctx->voccxdmc = daemons));
    vocinialo(vocctx, &vocctx->voccxalm, (vocctx->voccxalc = notifiers));

    /* no entries in vocwdef free list yet */
    vocctx->voccxwfre = VOCCXW_NONE;
}